

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

int run_test_tcp_open_connected(void)

{
  uv_stream_t *puVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  void *unaff_RBX;
  int iVar5;
  long *plVar6;
  uv_connect_cb p_Var7;
  code *pcVar8;
  long *plVar9;
  uv_shutdown_t *puVar10;
  undefined1 *puVar11;
  uv_connect_t *puVar12;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_tcp_t client;
  long alStack_1b8 [2];
  undefined1 auStack_1a8 [16];
  code *pcStack_198;
  void *pvStack_190;
  undefined1 auStack_188 [64];
  void *pvStack_148;
  uv_connect_cb ap_Stack_140 [2];
  uv__queue *puStack_130;
  uv__queue *puStack_128;
  code *pcStack_120;
  long local_110;
  long local_108;
  undefined1 local_100 [16];
  sockaddr local_f0;
  long local_e0 [27];
  
  pcStack_120 = (code *)0x1cd182;
  local_100 = uv_buf_init("PING",4);
  pcStack_120 = (code *)0x1cd1a2;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  local_e0[0] = (long)iVar2;
  local_110 = 0;
  if (local_e0[0] == 0) {
    pcStack_120 = (code *)0x1cd1c7;
    uVar3 = create_tcp_socket();
    unaff_RBX = (void *)(ulong)uVar3;
    pcStack_120 = (code *)0x1cd1da;
    iVar2 = connect(uVar3,&local_f0,0x10);
    local_e0[0] = (long)iVar2;
    local_110 = 0;
    if (local_e0[0] != 0) goto LAB_001cd3f7;
    pcStack_120 = (code *)0x1cd1ff;
    uVar4 = uv_default_loop();
    pcStack_120 = (code *)0x1cd20c;
    iVar2 = uv_tcp_init(uVar4,local_e0);
    local_110 = (long)iVar2;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001cd406;
    pcStack_120 = (code *)0x1cd238;
    iVar2 = uv_tcp_open(local_e0,uVar3);
    local_110 = (long)iVar2;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001cd415;
    pcStack_120 = (code *)0x1cd27a;
    iVar2 = uv_write(&write_req,local_e0,local_100,1,write_cb);
    local_110 = (long)iVar2;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001cd424;
    pcStack_120 = (code *)0x1cd2b2;
    iVar2 = uv_shutdown(&shutdown_req,local_e0,shutdown_cb);
    local_110 = (long)iVar2;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001cd433;
    pcStack_120 = (code *)0x1cd2ea;
    iVar2 = uv_read_start(local_e0,alloc_cb,read_cb);
    local_110 = (long)iVar2;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001cd442;
    pcStack_120 = (code *)0x1cd30f;
    uVar4 = uv_default_loop();
    pcStack_120 = (code *)0x1cd319;
    uv_run(uVar4,0);
    local_110 = 1;
    local_108 = (long)shutdown_cb_called;
    if (local_108 != 1) goto LAB_001cd451;
    local_110 = 1;
    local_108 = (long)write_cb_called;
    if (local_108 != 1) goto LAB_001cd460;
    local_110 = 1;
    local_108 = (long)close_cb_called;
    if (local_108 != 1) goto LAB_001cd46f;
    pcStack_120 = (code *)0x1cd38d;
    unaff_RBX = (void *)uv_default_loop();
    pcStack_120 = (code *)0x1cd3a1;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_120 = (code *)0x1cd3ab;
    uv_run(unaff_RBX,0);
    local_110 = 0;
    pcStack_120 = (code *)0x1cd3b9;
    uVar4 = uv_default_loop();
    pcStack_120 = (code *)0x1cd3c1;
    iVar2 = uv_loop_close(uVar4);
    local_108 = (long)iVar2;
    if (local_110 == local_108) {
      pcStack_120 = (code *)0x1cd3dd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1cd3f7;
    run_test_tcp_open_connected_cold_1();
LAB_001cd3f7:
    pcStack_120 = (code *)0x1cd406;
    run_test_tcp_open_connected_cold_2();
LAB_001cd406:
    pcStack_120 = (code *)0x1cd415;
    run_test_tcp_open_connected_cold_3();
LAB_001cd415:
    pcStack_120 = (code *)0x1cd424;
    run_test_tcp_open_connected_cold_4();
LAB_001cd424:
    pcStack_120 = (code *)0x1cd433;
    run_test_tcp_open_connected_cold_5();
LAB_001cd433:
    pcStack_120 = (code *)0x1cd442;
    run_test_tcp_open_connected_cold_6();
LAB_001cd442:
    pcStack_120 = (code *)0x1cd451;
    run_test_tcp_open_connected_cold_7();
LAB_001cd451:
    pcStack_120 = (code *)0x1cd460;
    run_test_tcp_open_connected_cold_8();
LAB_001cd460:
    pcStack_120 = (code *)0x1cd46f;
    run_test_tcp_open_connected_cold_9();
LAB_001cd46f:
    pcStack_120 = (code *)0x1cd47e;
    run_test_tcp_open_connected_cold_10();
  }
  plVar9 = &local_110;
  plVar6 = &local_108;
  pcStack_120 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if (plVar9 == (long *)0x0) {
    puStack_128 = (uv__queue *)0x1cd4a4;
    write_cb_cold_2();
  }
  else if ((int)plVar6 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar2 = (int)plVar6;
  puVar10 = (uv_shutdown_t *)((ulong)plVar6 & 0xffffffff);
  puStack_128 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar10 == &shutdown_req) {
    puStack_128 = (uv__queue *)(long)iVar2;
    puStack_130 = (uv__queue *)0x0;
    if (puStack_128 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar2;
    }
  }
  else {
    ap_Stack_140[0] = (uv_connect_cb)0x1cd4e8;
    shutdown_cb_cold_1();
  }
  p_Var7 = (uv_connect_cb)(auStack_188 + 0x58);
  ap_Stack_140[0] = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_148 = (void *)0x10000;
  if ((long)p_Var7 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x37fb20;
  }
  puVar11 = auStack_188 + 0x48;
  pcVar8 = (code *)(auStack_188 + 0x40);
  auStack_188._48_8_ = read_cb;
  ap_Stack_140[0] = p_Var7;
  alloc_cb_cold_1();
  if (puVar11 == (undefined1 *)0x0) {
    auStack_188._24_8_ = (void *)0x1cd5c8;
    read_cb_cold_4();
LAB_001cd5c8:
    auStack_188._24_8_ = (void *)0x1cd5d7;
    read_cb_cold_2();
LAB_001cd5d7:
    auStack_188._24_8_ = (void *)0x1cd5e6;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)pcVar8) {
      auStack_188._48_8_ = (code *)0x4;
      auStack_188._40_8_ = pcVar8;
      if (pcVar8 != (code *)0x4) goto LAB_001cd5c8;
      auStack_188._24_8_ = (void *)0x1cd578;
      iVar2 = memcmp("PING",(void *)*extraout_RDX_00,4);
      auStack_188._48_8_ = SEXT48(iVar2);
      auStack_188._40_8_ = (code *)0x0;
      if ((code *)auStack_188._48_8_ == (code *)0x0) {
        return iVar2;
      }
      goto LAB_001cd5d7;
    }
    auStack_188._40_8_ = (code *)0xfffffffffffff001;
    auStack_188._48_8_ = pcVar8;
    if (pcVar8 == (code *)0xfffffffffffff001) {
      iVar2 = uv_close();
      return iVar2;
    }
  }
  auStack_188._24_8_ = run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar5 = (int)&pvStack_190;
  pcStack_198 = (code *)0x1cd610;
  auStack_188._24_8_ = unaff_RBX;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_188 + 8);
  auStack_188._0_8_ = SEXT48(iVar2);
  pvStack_190 = (void *)0x0;
  if ((void *)auStack_188._0_8_ == (void *)0x0) {
    pcStack_198 = (code *)0x1cd633;
    uVar3 = create_tcp_socket();
    unaff_RBX = (void *)(ulong)uVar3;
    pcStack_198 = (code *)0x1cd63a;
    uVar4 = uv_default_loop();
    pcStack_198 = (code *)0x1cd649;
    iVar2 = uv_tcp_init(uVar4,&::client);
    auStack_188._0_8_ = SEXT48(iVar2);
    pvStack_190 = (void *)0x0;
    if ((void *)auStack_188._0_8_ != (void *)0x0) goto LAB_001cd7f6;
    pcStack_198 = (code *)0x1cd675;
    iVar2 = uv_tcp_open(&::client,uVar3);
    auStack_188._0_8_ = SEXT48(iVar2);
    pvStack_190 = (void *)0x0;
    if ((void *)auStack_188._0_8_ != (void *)0x0) goto LAB_001cd803;
    pcStack_198 = (code *)0x1cd6b2;
    iVar2 = uv_tcp_connect(&connect_req,&::client,auStack_188 + 8,connect1_cb);
    auStack_188._0_8_ = SEXT48(iVar2);
    pvStack_190 = (void *)0x0;
    if ((void *)auStack_188._0_8_ != (void *)0x0) goto LAB_001cd810;
    pcStack_198 = (code *)0x1cd6d5;
    uVar4 = uv_default_loop();
    pcStack_198 = (code *)0x1cd6df;
    uv_run(uVar4,0);
    auStack_188._0_8_ = (void *)0x1;
    pvStack_190 = (void *)(long)shutdown_cb_called;
    if (pvStack_190 != (void *)0x1) goto LAB_001cd81d;
    auStack_188._0_8_ = (void *)0x1;
    pvStack_190 = (void *)(long)shutdown_requested;
    if (pvStack_190 != (void *)0x1) goto LAB_001cd82a;
    auStack_188._0_8_ = (void *)0x1;
    pvStack_190 = (void *)(long)connect_cb_called;
    if (pvStack_190 != (void *)0x1) goto LAB_001cd837;
    auStack_188._0_8_ = SEXT48(write_cb_called);
    pvStack_190 = (void *)0x0;
    if ((long)auStack_188._0_8_ < 1) goto LAB_001cd844;
    auStack_188._0_8_ = (void *)0x1;
    pvStack_190 = (void *)(long)close_cb_called;
    if (pvStack_190 != (void *)0x1) goto LAB_001cd851;
    pcStack_198 = (code *)0x1cd793;
    unaff_RBX = (void *)uv_default_loop();
    pcStack_198 = (code *)0x1cd7a7;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_198 = (code *)0x1cd7b1;
    uv_run(unaff_RBX,0);
    auStack_188._0_8_ = (void *)0x0;
    pcStack_198 = (code *)0x1cd7bf;
    uVar4 = uv_default_loop();
    pcStack_198 = (code *)0x1cd7c7;
    iVar2 = uv_loop_close(uVar4);
    pvStack_190 = (void *)(long)iVar2;
    if ((void *)auStack_188._0_8_ == pvStack_190) {
      pcStack_198 = (code *)0x1cd7e1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_198 = (code *)0x1cd7f6;
    run_test_tcp_write_ready_cold_1();
LAB_001cd7f6:
    pcStack_198 = (code *)0x1cd803;
    run_test_tcp_write_ready_cold_2();
LAB_001cd803:
    pcStack_198 = (code *)0x1cd810;
    run_test_tcp_write_ready_cold_3();
LAB_001cd810:
    pcStack_198 = (code *)0x1cd81d;
    run_test_tcp_write_ready_cold_4();
LAB_001cd81d:
    pcStack_198 = (code *)0x1cd82a;
    run_test_tcp_write_ready_cold_5();
LAB_001cd82a:
    pcStack_198 = (code *)0x1cd837;
    run_test_tcp_write_ready_cold_6();
LAB_001cd837:
    pcStack_198 = (code *)0x1cd844;
    run_test_tcp_write_ready_cold_7();
LAB_001cd844:
    pcStack_198 = (code *)0x1cd851;
    run_test_tcp_write_ready_cold_8();
LAB_001cd851:
    pcStack_198 = (code *)0x1cd85e;
    run_test_tcp_write_ready_cold_9();
  }
  puVar12 = (uv_connect_t *)auStack_188;
  pcStack_198 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar1 = connect_req.handle;
  plVar9 = alStack_1b8;
  pcStack_198 = (code *)unaff_RBX;
  if (puVar12 == &connect_req) {
    auStack_1a8._0_8_ = SEXT48(iVar5);
    alStack_1b8[0] = 0;
    if (auStack_1a8._0_8_ != 0) goto LAB_001cd9a6;
    connect_cb_called = connect_cb_called + 1;
    uVar4 = uv_default_loop();
    iVar2 = uv_timer_init(uVar4,&tm);
    auStack_1a8._0_8_ = SEXT48(iVar2);
    alStack_1b8[0] = 0;
    if (auStack_1a8._0_8_ != 0) goto LAB_001cd9b3;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_1a8._0_8_ = SEXT48(iVar2);
    alStack_1b8[0] = 0;
    if (auStack_1a8._0_8_ != 0) goto LAB_001cd9c0;
    auStack_1a8 = uv_buf_init("P",1);
    iVar2 = uv_write(&write_req,puVar1,auStack_1a8,1,write1_cb);
    alStack_1b8[0] = (long)iVar2;
    alStack_1b8[1] = 0;
    if (alStack_1b8[0] == 0) {
      iVar2 = uv_read_start(puVar1,alloc_cb,read1_cb);
      alStack_1b8[0] = (long)iVar2;
      alStack_1b8[1] = 0;
      if (alStack_1b8[0] == 0) {
        return iVar2;
      }
      goto LAB_001cd9da;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cd9a6:
    connect1_cb_cold_2();
LAB_001cd9b3:
    connect1_cb_cold_3();
LAB_001cd9c0:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cd9da:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(plVar9,0);
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT_OK(connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &client));

  ASSERT_OK(uv_tcp_open(&client, sock));

  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &client,
                     &buf,
                     1,
                     write_cb));

  ASSERT_OK(uv_shutdown(&shutdown_req,
                        (uv_stream_t*) &client,
                        shutdown_cb));

  ASSERT_OK(uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}